

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QItemDelegate * __thiscall
QItemDelegate::selectedPixmap(QItemDelegate *this,QPixmap *pixmap,QPalette *palette,bool enabled)

{
  bool bVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long *plVar7;
  undefined7 in_register_00000009;
  QChar *pQVar8;
  long in_FS_OFFSET;
  QPainter painter;
  QPixmap aQStack_d8 [16];
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  QString local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  undefined1 *local_58;
  undefined8 uStack_50;
  QChar local_48;
  short local_46;
  undefined1 auStack_44 [12];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  uVar6 = QPixmap::cacheKey();
  pQVar8 = &local_48;
  local_58 = (undefined1 *)0x0;
  uStack_50 = 0;
  local_68 = (undefined1  [8])0x0;
  uStack_60 = (undefined1 *)0x0;
  local_48.ucs = L'-';
  local_46 = (short)CONCAT71(in_register_00000009,enabled) + 0x30;
  if (uVar6 != 0) {
    do {
      pQVar8[-1].ucs = (ushort)uVar6 & 0xf | 0x30;
      pQVar8 = pQVar8 + -1;
      bVar1 = 0xf < uVar6;
      uVar6 = uVar6 >> 4;
    } while (bVar1);
  }
  QString::QString(&local_98,pQVar8,(long)(int)((ulong)(auStack_44 + -(long)pQVar8) >> 1));
  *(undefined1 **)&this[1].super_QAbstractItemDelegate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->super_QAbstractItemDelegate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QAbstractItemDelegate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this);
  cVar3 = QPixmapCache::find((QString *)&local_98,(QPixmap *)this);
  if (cVar3 == '\0') {
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::toImage();
    QImage::convertToFormat
              ((QImage *)&local_b8,(Format)(QImage *)local_68,(ImageConversionFlags)0x6);
    QImage::~QImage((QImage *)local_68);
    plVar7 = (long *)QPalette::brush((ColorGroup)palette,(uint)!enabled);
    local_78 = *(undefined8 *)(*plVar7 + 8);
    uStack_70 = *(undefined8 *)(*plVar7 + 0x10);
    QColor::setAlphaF(0.3);
    local_c0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)local_c0,(QPaintDevice *)&local_b8);
    QPainter::setCompositionMode((CompositionMode)(QRect *)local_c0);
    iVar4 = QImage::width();
    iVar5 = QImage::height();
    local_68 = (undefined1  [8])0x0;
    uStack_60._4_4_ = iVar5 + -1;
    uStack_60._0_4_ = iVar4 + -1;
    QPainter::fillRect((QRect *)local_c0,(QColor *)local_68);
    QPainter::end();
    QPixmap::fromImage(aQStack_d8,(QImage *)&local_b8,0);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_68);
    uVar2 = local_c8;
    local_68 = (undefined1  [8])QDataStream::operator<<;
    local_c8 = 0;
    local_58 = *(undefined1 **)&this[1].super_QAbstractItemDelegate;
    *(undefined8 *)&this[1].super_QAbstractItemDelegate = uVar2;
    QPixmap::~QPixmap((QPixmap *)local_68);
    QPixmap::~QPixmap(aQStack_d8);
    uVar6 = QImage::sizeInBytes();
    iVar5 = (int)(uVar6 >> 10) + 1;
    iVar4 = QPixmapCache::cacheLimit();
    if (iVar4 < iVar5) {
      QPixmapCache::setCacheLimit(iVar5);
    }
    QPixmapCache::insert((QString *)&local_98,(QPixmap *)this);
    QPainter::~QPainter((QPainter *)local_c0);
    QImage::~QImage((QImage *)&local_b8);
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QPixmap QItemDelegate::selectedPixmap(const QPixmap &pixmap, const QPalette &palette, bool enabled)
{
    const QString key = qPixmapSerial(pixmap.cacheKey(), enabled);
    QPixmap pm;
    if (!QPixmapCache::find(key, &pm)) {
        QImage img = pixmap.toImage().convertToFormat(QImage::Format_ARGB32_Premultiplied);

        QColor color = palette.color(enabled ? QPalette::Normal : QPalette::Disabled,
                                     QPalette::Highlight);
        color.setAlphaF(0.3f);

        QPainter painter(&img);
        painter.setCompositionMode(QPainter::CompositionMode_SourceAtop);
        painter.fillRect(0, 0, img.width(), img.height(), color);
        painter.end();

        pm = QPixmap(QPixmap::fromImage(img));
        const int n = (img.sizeInBytes() >> 10) + 1;
        if (QPixmapCache::cacheLimit() < n)
            QPixmapCache::setCacheLimit(n);

        QPixmapCache::insert(key, pm);
    }
    return pm;
}